

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O1

int_mv av1_simple_motion_search_sse_var
                 (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int ref,
                 FULLPEL_MV start_mv,int num_planes,int use_subpixel,uint *sse,uint *var)

{
  uint8_t uVar1;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int mi_ext_col;
  int iVar2;
  int_mv iVar3;
  RefCntBuffer *pRVar4;
  scale_factors *psVar5;
  byte bVar6;
  BLOCK_SIZE BVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int *cost_list_00;
  byte bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined7 in_register_00000081;
  undefined4 in_register_0000008c;
  byte bVar16;
  uint ref_frame;
  long lVar17;
  YV12_BUFFER_CONFIG *pYVar18;
  search_site_config *search_sites;
  bool bVar19;
  MV ref_mv;
  FULLPEL_MV_STATS best_mv_stats;
  int not_used;
  buf_2d backup_yv12;
  int cost_list [5];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MV local_264;
  YV12_BUFFER_CONFIG *local_260;
  MACROBLOCKD *local_258;
  ulong local_250;
  uint local_248;
  MV local_244;
  ulong local_240;
  int local_234;
  MB_MODE_INFO *local_230;
  undefined8 local_228;
  ulong local_220;
  FULLPEL_MV_STATS local_214;
  AV1_COMMON *local_208;
  int local_1fc;
  uint8_t *local_1f8;
  uint8_t *puStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int local_1d8 [8];
  FULLPEL_MOTION_SEARCH_PARAMS local_1b8;
  SUBPEL_MOTION_SEARCH_PARAMS local_d8;
  
  local_228 = CONCAT44(in_register_0000008c,ref);
  local_250 = (ulong)(uint)mi_col;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  local_220 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_220];
  bVar11 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_220];
  iVar10 = (cpi->common).mi_params.mi_stride;
  iVar14 = iVar10 * mi_row + mi_col;
  iVar8 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  iVar2 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  (cpi->common).mi_params.mi_grid_base[iVar14] =
       (cpi->common).mi_params.mi_alloc + ((cpi->common).mi_params.mi_alloc_stride * iVar8 + iVar2);
  (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar14;
  (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar14;
  (x->e_mbd).tx_type_map_stride = iVar10;
  x->mbmi_ext_frame =
       (cpi->mbmi_ext_info).frame_base + (iVar8 * (cpi->mbmi_ext_info).stride + iVar2);
  uVar9 = (uint)(uVar1 == '\0') * 2 + 1;
  local_260 = (YV12_BUFFER_CONFIG *)(ulong)uVar9;
  local_208 = &cpi->common;
  lVar17 = 0;
  local_258 = (MACROBLOCKD *)CONCAT44(local_258._4_4_,(int)CONCAT71(in_register_00000081,bsize));
  av1_setup_dst_planes((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,uVar9)
  ;
  iVar10 = (cpi->oxcf).border_in_pixels;
  iVar8 = 8 - (iVar10 + mi_row * 4);
  iVar2 = ((uint)bVar11 + mi_row) * -4 + -8;
  if (iVar2 < iVar8) {
    iVar2 = iVar8;
  }
  (x->mv_limits).row_min = iVar2;
  iVar8 = (cpi->common).mi_params.mi_rows;
  iVar14 = iVar8 - mi_row;
  iVar2 = iVar14 * 4 + 8;
  iVar14 = iVar10 + (iVar14 - (uint)bVar11) * 4 + -8;
  if (iVar14 < iVar2) {
    iVar2 = iVar14;
  }
  iVar14 = (int)local_250;
  iVar13 = 8 - (iVar10 + iVar14 * 4);
  iVar15 = ((uint)bVar12 + iVar14) * -4 + -8;
  if (iVar15 < iVar13) {
    iVar15 = iVar13;
  }
  (x->mv_limits).row_max = iVar2;
  (x->mv_limits).col_min = iVar15;
  iVar15 = (cpi->common).mi_params.mi_cols;
  iVar13 = iVar15 - iVar14;
  iVar2 = iVar13 * 4 + 8;
  iVar10 = iVar10 + (iVar13 - (uint)bVar12) * 4 + -8;
  if (iVar10 < iVar2) {
    iVar2 = iVar10;
  }
  (x->mv_limits).col_max = iVar2;
  do {
    bVar6 = (byte)(((uint)bVar11 << 2) >>
                  (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar17 + -0x28) & 0x1f));
    bVar16 = (byte)(((uint)bVar12 << 2) >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar17 + -0x2c) & 0x1f));
    if (bVar16 < 5) {
      bVar16 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar17 + 0x90) = bVar16;
    if (bVar6 < 5) {
      bVar6 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar17 + 0x91) = bVar6;
    lVar17 = lVar17 + 0xa30;
  } while ((long)local_260 * 0xa30 - lVar17 != 0);
  (x->e_mbd).mi_row = mi_row;
  (x->e_mbd).mi_col = iVar14;
  (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
  (x->e_mbd).mb_to_bottom_edge = (iVar8 - ((uint)bVar11 + mi_row)) * 0x20;
  (x->e_mbd).mb_to_left_edge = iVar14 * -0x20;
  (x->e_mbd).mb_to_right_edge = (iVar15 - ((uint)bVar12 + iVar14)) * 0x20;
  BVar7 = (BLOCK_SIZE)local_258;
  uVar9 = (uint)(BLOCK_SIZE)local_258;
  local_240 = (ulong)(uint)mi_row;
  av1_setup_src_planes(x,cpi->source,mi_row,iVar14,(int)local_260,(BLOCK_SIZE)local_258);
  local_230 = *(x->e_mbd).mi;
  local_230->bsize = BVar7;
  local_230->ref_frame[0] = (char)local_228;
  local_230->ref_frame[1] = -1;
  local_230->motion_mode = '\0';
  (local_230->interp_filters).as_int = 0;
  bVar12 = (char)local_228 - 1;
  iVar10 = -1;
  ref_frame = (uint)local_228;
  if (bVar12 < 8) {
    iVar10 = (cpi->common).remapped_ref_idx[(ref_frame & 0xff) - 1];
  }
  if (iVar10 == -1) {
    pRVar4 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar4 = (cpi->common).ref_frame_map[iVar10];
  }
  local_258 = &x->e_mbd;
  pYVar18 = &pRVar4->buf;
  if (pRVar4 == (RefCntBuffer *)0x0) {
    pYVar18 = (YV12_BUFFER_CONFIG *)0x0;
  }
  local_248 = uVar9;
  local_260 = av1_get_scaled_ref_frame(cpi,ref_frame);
  local_244.row = 0;
  local_244.col = 0;
  iVar10 = (cpi->sf).part_sf.simple_motion_search_reduce_search_steps +
           (cpi->mv_search_params).mv_step_param;
  local_234 = 9;
  if (iVar10 < 9) {
    local_234 = iVar10;
  }
  iVar2 = -1;
  iVar10 = -1;
  if (bVar12 < 8) {
    iVar10 = (cpi->common).remapped_ref_idx[(ref_frame & 0xff) - 1];
  }
  psVar5 = (scale_factors *)0x0;
  if (iVar10 != -1) {
    psVar5 = (cpi->common).ref_scale_factors + iVar10;
  }
  av1_setup_pre_planes(local_258,0,pYVar18,(int)local_240,(int)local_250,psVar5,num_planes);
  bVar12 = local_230->ref_frame[0];
  bVar11 = local_230->ref_frame[1];
  if ((char)bVar12 < '\t') {
    bVar6 = 1;
    if ('\x01' < (char)bVar12) {
      bVar6 = bVar12;
    }
    iVar2 = (cpi->common).remapped_ref_idx[bVar6 - 1];
  }
  psVar5 = (scale_factors *)0x0;
  if (iVar2 != -1) {
    psVar5 = (cpi->common).ref_scale_factors + iVar2;
  }
  (x->e_mbd).block_ref_scale_factors[0] = psVar5;
  iVar10 = -1;
  if ((char)bVar11 < '\t') {
    bVar12 = 1;
    if ('\x01' < (char)bVar11) {
      bVar12 = bVar11;
    }
    iVar10 = (cpi->common).remapped_ref_idx[bVar12 - 1];
  }
  uVar9 = 0;
  psVar5 = (scale_factors *)0x0;
  if (iVar10 != -1) {
    psVar5 = (cpi->common).ref_scale_factors + iVar10;
  }
  (x->e_mbd).block_ref_scale_factors[1] = psVar5;
  if (local_260 != (YV12_BUFFER_CONFIG *)0x0) {
    local_1f8 = (x->e_mbd).plane[0].pre[0].buf;
    puStack_1f0 = (x->e_mbd).plane[0].pre[0].buf0;
    local_1e8._0_4_ = (x->e_mbd).plane[0].pre[0].width;
    local_1e8._4_4_ = (x->e_mbd).plane[0].pre[0].height;
    uStack_1e0 = *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride;
    av1_setup_pre_planes
              (local_258,0,local_260,(int)local_240,(int)local_250,(scale_factors *)0x0,num_planes);
  }
  if ((cpi->is_screen_content_type != 0) &&
     ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x03')) {
    uVar9 = (uint)((cpi->oxcf).speed < 3);
  }
  bVar12 = (cpi->sf).mv_sf.search_method;
  iVar10 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
  bVar11 = block_size_high[local_220];
  if (block_size_wide[local_220] < block_size_high[local_220]) {
    bVar11 = block_size_wide[local_220];
  }
  if ((iVar10 == 1 && 0x1f < bVar11) ||
     (((0xf < bVar11 && 1 < iVar10 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
      (x->qindex < 0xc0)))) {
    if (bVar12 < 0xb) {
      bVar12 = (&DAT_0056bd80)[bVar12];
    }
    else {
      bVar12 = 0;
    }
  }
  iVar10 = (x->e_mbd).plane[0].pre[0].stride;
  if (iVar10 == (cpi->mv_search_params).search_site_cfg[0][0].stride) {
    search_sites = (cpi->mv_search_params).search_site_cfg[0];
  }
  else if (iVar10 == (cpi->mv_search_params).search_site_cfg[1][0].stride) {
    search_sites = (cpi->mv_search_params).search_site_cfg[1];
  }
  else {
    search_sites = x->search_site_cfg_buf;
    if (iVar10 != x->search_site_cfg_buf[""[bVar12]].stride) {
      (*av1_init_motion_compensation[""[""[bVar12]]])
                (search_sites + ""[""[bVar12]],iVar10,SUB14((bVar12 & 0xfe) == 2,0));
    }
  }
  av1_make_default_fullpel_ms_params
            (&local_1b8,cpi,x,(BLOCK_SIZE)local_248,&local_244,start_mv,search_sites,bVar12,uVar9);
  pYVar18 = local_260;
  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
    cost_list_00 = (int *)0x0;
  }
  else {
    cost_list_00 = local_1d8;
    if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
      cost_list_00 = (int *)0x0;
    }
  }
  iVar10 = av1_full_pixel_search
                     (start_mv,&local_1b8,local_234,cost_list_00,&local_264,&local_214,
                      (FULLPEL_MV *)0x0);
  if (iVar10 == 0x7fffffff) {
    bVar19 = false;
  }
  else {
    bVar19 = false;
    if ((use_subpixel != 0) &&
       (bVar19 = false, (cpi->common).features.cur_frame_force_integer_mv == false)) {
      bVar19 = (cpi->sf).mv_sf.simple_motion_subpel_force_stop != '\x03';
    }
  }
  if (pYVar18 != (YV12_BUFFER_CONFIG *)0x0) {
    (x->e_mbd).plane[0].pre[0].width = (undefined4)local_1e8;
    (x->e_mbd).plane[0].pre[0].height = local_1e8._4_4_;
    *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uStack_1e0;
    (x->e_mbd).plane[0].pre[0].buf = local_1f8;
    (x->e_mbd).plane[0].pre[0].buf0 = puStack_1f0;
  }
  if (bVar19) {
    local_1fc = 0;
    BVar7 = (BLOCK_SIZE)local_248;
    av1_make_default_subpel_ms_params(&local_d8,cpi,x,BVar7,&local_244,local_1d8);
    cm = local_208;
    xd = local_258;
    local_d8.forced_stop = (cpi->sf).mv_sf.simple_motion_subpel_force_stop;
    (*(cpi->mv_search_params).find_fractional_mv_step)
              (local_258,local_208,&local_d8,
               (MV)(((uint)local_264 >> 0x10) * 0x80000 + ((uint)local_264 & 0x1fff) * 8),&local_214
               ,(MV *)&local_264,&local_1fc,x->pred_sse + (int)local_228,(int_mv *)0x0);
    local_230->mv[0].as_int = (uint32_t)local_264;
    av1_enc_build_inter_predictor(cm,xd,(int)local_240,(int)local_250,(BUFFER_SET *)0x0,BVar7,0,0);
    local_214.sse =
         (*cpi->ppi->fn_ptr[local_220].vf)
                   (x->plane[0].src.buf,x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                    (x->e_mbd).plane[0].dst.stride,sse);
  }
  else {
    local_264 = (FULLPEL_MV)(((uint)local_264 >> 0x10) * 0x80000 + ((uint)local_264 & 0x1fff) * 8);
    *var = local_214.distortion;
    var = sse;
  }
  *var = local_214.sse;
  iVar3._0_2_ = local_264.row;
  iVar3._2_2_ = local_264.col;
  return (int_mv)iVar3.as_int;
}

Assistant:

int_mv av1_simple_motion_search_sse_var(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        BLOCK_SIZE bsize, int ref,
                                        FULLPEL_MV start_mv, int num_planes,
                                        int use_subpixel, unsigned int *sse,
                                        unsigned int *var) {
  assert(num_planes == 1 &&
         "Currently simple_motion_search only supports luma plane");
  assert(!frame_is_intra_only(&cpi->common) &&
         "Simple motion search only enabled for non-key frames");
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;

  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->ref_frame[0] = ref;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interp_filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, ref);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  struct buf_2d backup_yv12;
  // ref_mv is used to calculate the cost of the motion vector
  const MV ref_mv = kZeroMv;
  const int step_param =
      AOMMIN(cpi->mv_search_params.mv_step_param +
                 cpi->sf.part_sf.simple_motion_search_reduce_search_steps,
             MAX_MVSEARCH_STEPS - 2);
  int cost_list[5];
  const int ref_idx = 0;
  int bestsme;
  int_mv best_mv;
  FULLPEL_MV_STATS best_mv_stats;

  av1_setup_pre_planes(xd, ref_idx, yv12, mi_row, mi_col,
                       get_ref_scale_factors(cm, ref), num_planes);
  set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  if (scaled_ref_frame) {
    backup_yv12 = xd->plane[AOM_PLANE_Y].pre[ref_idx];
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &ref_mv,
                                     start_mv, src_search_sites, search_method,
                                     fine_search_interval);

  bestsme = av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list),
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  const int use_subpel_search =
      bestsme < INT_MAX && !cpi->common.features.cur_frame_force_integer_mv &&
      use_subpixel &&
      (cpi->sf.mv_sf.simple_motion_subpel_force_stop != FULL_PEL);
  if (scaled_ref_frame) {
    xd->plane[AOM_PLANE_Y].pre[ref_idx] = backup_yv12;
  }
  if (use_subpel_search) {
    int not_used = 0;

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    // TODO(yunqing): integrate this into av1_make_default_subpel_ms_params().
    ms_params.forced_stop = mv_sf->simple_motion_subpel_force_stop;

    MV subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &best_mv.as_mv,
        &not_used, &x->pred_sse[ref], NULL);

    mbmi->mv[0] = best_mv;

    // Get a copy of the prediction output
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
    *var = cpi->ppi->fn_ptr[bsize].vf(
        x->plane[0].src.buf, x->plane[0].src.stride, xd->plane[0].dst.buf,
        xd->plane[0].dst.stride, sse);
  } else {
    // Manually convert from units of pixel to 1/8-pixels if we are not doing
    // subpel search
    convert_fullmv_to_mv(&best_mv);
    *var = best_mv_stats.distortion;
    *sse = best_mv_stats.sse;
  }

  return best_mv;
}